

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

const_iterator * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::cbegin(const_iterator *__return_storage_ptr__,
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *this)

{
  __return_storage_ptr__->m_object = this;
  (__return_storage_ptr__->m_it).object_iterator._M_node = (_Base_ptr)0x0;
  (__return_storage_ptr__->m_it).array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  (__return_storage_ptr__->m_it).primitive_iterator.m_it = -0x8000000000000000;
  if (this->m_type == array) {
    (__return_storage_ptr__->m_it).array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
  }
  else if (this->m_type == object) {
    (__return_storage_ptr__->m_it).object_iterator._M_node = (_Base_ptr)0x0;
  }
  else {
    (__return_storage_ptr__->m_it).primitive_iterator.m_it = -0x8000000000000000;
  }
  detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_begin(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const_iterator cbegin() const noexcept {
		const_iterator result(this);
		result.set_begin();
		return result;
	}